

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agsmock.cpp
# Opt level: O2

void __thiscall AGSMock::MissingFunction::MissingFunction(MissingFunction *this,char *name)

{
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Tried to call undefined script function: ",&local_59);
  std::operator+(&local_58,&local_38,name);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__runtime_error_00110658;
  return;
}

Assistant:

MissingFunction::MissingFunction(const char *name)
	: runtime_error(string("Tried to call undefined script function: ") + name) {}